

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int CVmObjFileName::call_stat_prop(vm_val_t *result,uchar **pc_ptr,uint *argc,vm_prop_id_t prop)

{
  int iVar1;
  vm_prop_id_t in_CX;
  uint *in_RDX;
  uchar **in_RSI;
  vm_val_t *in_RDI;
  uint *unaff_retaddr;
  vm_val_t *in_stack_00000008;
  uint midx;
  uint *in_stack_00000140;
  vm_val_t *in_stack_00000148;
  vm_prop_id_t in_stack_ffffffffffffffd2;
  uint in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  CVmMetaclass::get_reg_idx(metaclass_reg_);
  iVar1 = CVmMetaTable::prop_to_vector_idx
                    ((CVmMetaTable *)
                     CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
                     in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd2);
  if (iVar1 == 4) {
    local_4 = s_getp_fromUniversal(in_stack_00000008,unaff_retaddr);
  }
  else if (iVar1 == 9) {
    local_4 = s_getp_getRootDirs(in_stack_00000148,in_stack_00000140);
  }
  else {
    local_4 = CVmObject::call_stat_prop(in_RDI,in_RSI,in_RDX,in_CX);
  }
  return local_4;
}

Assistant:

int CVmObjFileName::call_stat_prop(VMG_ vm_val_t *result,
                                   const uchar **pc_ptr, uint *argc,
                                   vm_prop_id_t prop)
{
    /* look up the function */
    uint midx = G_meta_table
                ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    switch (midx)
    {
    case VMOFN_FROMUNIVERSAL:
        return s_getp_fromUniversal(vmg_ result, argc);

    case VMOFN_GETROOTDIRS:
        return s_getp_getRootDirs(vmg_ result, argc);

    default:
        /* it's not ours - inherit the default handling */
        return CVmObject::call_stat_prop(vmg_ result, pc_ptr, argc, prop);
    }
}